

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void LogLuv24toXYZ(uint32_t p,float *XYZ)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double v;
  double u;
  double local_28;
  double local_20;
  double local_18;
  
  local_18 = 0.0;
  uVar1 = p >> 0xe & 0x3ff;
  if (uVar1 != 0) {
    local_18 = exp(((double)uVar1 + 0.5) * 0.010830424696249145 + -8.317766166719343);
  }
  if (local_18 <= 0.0) {
    XYZ[2] = 0.0;
    XYZ[0] = 0.0;
    XYZ[1] = 0.0;
  }
  else {
    iVar2 = uv_decode(&local_20,&local_28,p & 0x3fff);
    if (iVar2 < 0) {
      local_20 = 0.210526316;
      local_28 = 0.473684211;
    }
    dVar4 = 1.0 / (local_20 * 6.0 + local_28 * -16.0 + 12.0);
    dVar3 = local_20 * 9.0 * dVar4;
    dVar4 = local_28 * 4.0 * dVar4;
    *XYZ = (float)((dVar3 / dVar4) * local_18);
    XYZ[1] = (float)local_18;
    XYZ[2] = (float)((((1.0 - dVar3) - dVar4) / dVar4) * local_18);
  }
  return;
}

Assistant:

void
    LogLuv24toXYZ(uint32_t p, float *XYZ)
{
    int Ce;
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL10toY(p >> 14 & 0x3ff);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    Ce = p & 0x3fff;
    if (uv_decode(&u, &v, Ce) < 0)
    {
        u = U_NEU;
        v = V_NEU;
    }
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}